

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O1

aigPoIndices * allocAigPoIndices(void)

{
  aigPoIndices *paVar1;
  
  paVar1 = (aigPoIndices *)malloc(0x10);
  paVar1->attrPendingSignalIndex = -1;
  paVar1->attrHintSingalBeginningMarker = -1;
  paVar1->attrHintSingalEndMarker = -1;
  paVar1->attrSafetyInvarIndex = -1;
  return paVar1;
}

Assistant:

struct aigPoIndices *allocAigPoIndices()
{
    struct aigPoIndices *newAigPoIndices;

    newAigPoIndices = (struct aigPoIndices *)malloc(sizeof (struct aigPoIndices));
    newAigPoIndices->attrPendingSignalIndex = -1;
    newAigPoIndices->attrHintSingalBeginningMarker = -1;
    newAigPoIndices->attrHintSingalEndMarker = -1;
    newAigPoIndices->attrSafetyInvarIndex = -1;

    assert( newAigPoIndices != NULL );
    return newAigPoIndices;
}